

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_gsv_text.cpp
# Opt level: O1

uint __thiscall agg::gsv_text::vertex(gsv_text *this,double *x,double *y)

{
  char cVar1;
  char cVar2;
  char *pcVar3;
  int8u *piVar4;
  int8u *piVar5;
  int8u *piVar6;
  ulong uVar7;
  byte *pbVar8;
  int8u *piVar9;
  int8u *piVar10;
  status sVar11;
  bool bVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  if ((this->m_flip & 1U) == 0) {
    dVar13 = this->m_height + this->m_line_space;
  }
  else {
    dVar13 = -this->m_height - this->m_line_space;
  }
  dVar15 = this->m_x;
  dVar14 = this->m_y;
  pcVar3 = this->m_bglyph;
  sVar11 = this->m_status;
  pbVar8 = (byte *)this->m_cur_chr;
  bVar12 = false;
  do {
    switch(sVar11) {
    case initial:
      if (this->m_font != (void *)0x0) {
        this->m_status = next_char;
        sVar11 = next_char;
        goto switchD_00114cbc_caseD_1;
      }
LAB_00114d1d:
      bVar12 = true;
      break;
    case next_char:
switchD_00114cbc_caseD_1:
      if (*pbVar8 == 0) goto LAB_00114d1d;
      this->m_cur_chr = (char *)(pbVar8 + 1);
      uVar7 = (ulong)*pbVar8;
      if (uVar7 != 10) {
        piVar4 = this->m_indices;
        bVar12 = this->m_big_endian != false;
        piVar9 = piVar4 + uVar7 * 2;
        piVar5 = piVar4 + uVar7 * 2 + 1;
        if (bVar12) {
          piVar9 = piVar4 + uVar7 * 2 + 1;
          piVar5 = piVar4 + uVar7 * 2;
        }
        piVar10 = piVar4 + uVar7 * 2 + 2;
        piVar6 = piVar4 + uVar7 * 2 + 3;
        if (bVar12) {
          piVar10 = piVar4 + uVar7 * 2 + 3;
          piVar6 = piVar4 + uVar7 * 2 + 2;
        }
        this->m_bglyph = this->m_glyphs + CONCAT11(*piVar5,*piVar9);
        this->m_eglyph = this->m_glyphs + CONCAT11(*piVar6,*piVar10);
        this->m_status = start_glyph;
switchD_00114cbc_caseD_2:
        *x = this->m_x;
        *y = this->m_y;
        this->m_status = glyph;
        return 1;
      }
      this->m_x = this->m_start_x;
      dVar14 = dVar14 - dVar13;
      this->m_y = dVar14;
      pbVar8 = pbVar8 + 1;
      dVar15 = this->m_start_x;
      break;
    case start_glyph:
      goto switchD_00114cbc_caseD_2;
    case glyph:
      if (pcVar3 < this->m_eglyph) {
        this->m_bglyph = pcVar3 + 1;
        cVar1 = *pcVar3;
        this->m_bglyph = pcVar3 + 2;
        cVar2 = pcVar3[1];
        dVar13 = (double)(int)cVar1 * this->m_w + this->m_x;
        this->m_x = dVar13;
        this->m_y = (double)(int)((char)(cVar2 * '\x02') >> 1) * this->m_h + this->m_y;
        *x = dVar13;
        *y = this->m_y;
        return (-1 < cVar2) + 1;
      }
      this->m_status = next_char;
      dVar15 = dVar15 + this->m_space;
      this->m_x = dVar15;
      sVar11 = next_char;
    }
    if (bVar12) {
      return 0;
    }
  } while( true );
}

Assistant:

unsigned gsv_text::vertex(double* x, double* y)
    {
        unsigned idx;
        int8 yc, yf;
        int dx, dy;
        bool quit = false;
        
        while(!quit)
        {
            switch(m_status)
            {
            case initial:
                if(m_font == 0) 
                {
                    quit = true;
                    break;
                }
                m_status = next_char;

            case next_char:
                if(*m_cur_chr == 0) 
                {
                    quit = true;
                    break;
                }
                idx = (*m_cur_chr++) & 0xFF;
                if(idx == '\n')
                {
                    m_x = m_start_x;
                    m_y -= m_flip ? -m_height - m_line_space : m_height + m_line_space;
                    break;
                }
                idx <<= 1;
                m_bglyph = m_glyphs + value(m_indices + idx);
                m_eglyph = m_glyphs + value(m_indices + idx + 2);
                m_status = start_glyph;

            case start_glyph:
                *x = m_x;
                *y = m_y;
                m_status = glyph;
                return path_cmd_move_to;

            case glyph:
                if(m_bglyph >= m_eglyph)
                {
                    m_status = next_char;
                    m_x += m_space;
                    break;
                }
                dx = int(*m_bglyph++);
                yf = (yc = *m_bglyph++) & 0x80;
                yc <<= 1; 
                yc >>= 1;
                dy = int(yc);
                m_x += double(dx) * m_w;
                m_y += double(dy) * m_h;
                *x = m_x;
                *y = m_y;
                return yf ? path_cmd_move_to : path_cmd_line_to;
            }

        }
        return path_cmd_stop;
    }